

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset,
              int depth)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t uVar3;
  ushort uVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  
  pvVar8 = encoded.bytes;
  uVar9 = encoded.len;
  iVar7 = -2;
  if (100 < depth) {
    return -2;
  }
  sVar5 = *offset;
  uVar1 = sVar5 + 1;
  *offset = uVar1;
  if (uVar9 < uVar1) {
    return -2;
  }
  uVar3 = *(uint8_t *)((long)pvVar8 + sVar5);
  entry->kind = uVar3;
  switch(uVar3) {
  case 'A':
    iVar7 = amqp_decode_array(encoded,pool,&(entry->value).array,offset,depth + 1);
    return iVar7;
  case 'B':
switchD_0010a08d_caseD_62:
    sVar5 = *offset;
    uVar1 = sVar5 + 1;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar8 + sVar5);
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_0010a08d_caseD_63;
  case 'D':
    sVar5 = *offset;
    uVar1 = sVar5 + 1;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -2;
    }
    (entry->value).i8 = *(int8_t *)((long)pvVar8 + sVar5);
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -2;
    }
    uVar6 = *(uint *)((long)pvVar8 + sVar5);
    (entry->value).decimal.value =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    break;
  case 'F':
    iVar7 = amqp_decode_table_internal(encoded,pool,&(entry->value).table,offset,depth + 1);
    return iVar7;
  case 'I':
switchD_0010a08d_caseD_66:
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -2;
    }
    uVar6 = *(uint *)((long)pvVar8 + sVar5);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
LAB_0010a1ba:
    *(uint *)&entry->value = uVar6;
    break;
  case 'L':
  case 'T':
switchD_0010a08d_caseD_64:
    sVar5 = *offset;
    uVar1 = sVar5 + 8;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -2;
    }
    uVar9 = *(ulong *)((long)pvVar8 + sVar5);
    (entry->value).u64 =
         uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
         (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
         (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    break;
  case 'S':
switchD_0010a0c1_caseD_53:
    sVar5 = *offset;
    uVar1 = sVar5 + 4;
    *offset = uVar1;
    if (uVar9 < uVar1) {
      return -2;
    }
    uVar6 = *(uint *)((long)pvVar8 + sVar5);
    uVar10 = (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
                    );
    uVar2 = uVar1 + uVar10;
    *offset = uVar2;
    if (uVar9 < uVar2) {
      return -2;
    }
    (entry->value).bytes.bytes = (void *)((long)pvVar8 + uVar1);
    (entry->value).i64 = uVar10;
    break;
  case 'V':
    break;
  default:
    switch(uVar3) {
    case 'b':
      goto switchD_0010a08d_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_0010a08d_caseD_63;
    case 'd':
    case 'l':
      goto switchD_0010a08d_caseD_64;
    case 'f':
    case 'i':
      goto switchD_0010a08d_caseD_66;
    case 's':
    case 'u':
      sVar5 = *offset;
      uVar1 = sVar5 + 2;
      *offset = uVar1;
      if (uVar9 < uVar1) {
        return -2;
      }
      uVar4 = *(ushort *)((long)pvVar8 + sVar5);
      (entry->value).u16 = uVar4 << 8 | uVar4 >> 8;
      break;
    case 't':
      sVar5 = *offset;
      uVar1 = sVar5 + 1;
      *offset = uVar1;
      if (uVar9 < uVar1) {
        return -2;
      }
      uVar6 = (uint)(*(char *)((long)pvVar8 + sVar5) != '\0');
      goto LAB_0010a1ba;
    default:
      if (uVar3 != 'x') {
        return -2;
      }
      goto switchD_0010a0c1_caseD_53;
    }
  }
  iVar7 = 0;
switchD_0010a08d_caseD_63:
  return iVar7;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded, amqp_pool_t *pool,
                                   amqp_field_value_t *entry, size_t *offset,
                                   int depth) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (depth > TABLE_DEPTH_LIMIT) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits)                                          \
  if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; \
  break
#define SIMPLE_FIELD_DECODER(bits, dest, how)                 \
  {                                                           \
    uint##bits##_t val;                                       \
    if (!amqp_decode_##bits(encoded, offset, &val)) goto out; \
    entry->value.dest = how;                                  \
  }                                                           \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
    case AMQP_FIELD_KIND_U8:
      TRIVIAL_FIELD_DECODER(8);

    case AMQP_FIELD_KIND_I16:
      SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
    case AMQP_FIELD_KIND_U16:
      TRIVIAL_FIELD_DECODER(16);

    case AMQP_FIELD_KIND_I32:
      SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
    case AMQP_FIELD_KIND_U32:
      TRIVIAL_FIELD_DECODER(32);

    case AMQP_FIELD_KIND_I64:
      SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
    case AMQP_FIELD_KIND_U64:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_F32:
      TRIVIAL_FIELD_DECODER(32);
      /* and by punning, f32 magically gets the right value...! */

    case AMQP_FIELD_KIND_F64:
      TRIVIAL_FIELD_DECODER(64);
      /* and by punning, f64 magically gets the right value...! */

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals) ||
          !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES: {
      uint32_t len;
      if (!amqp_decode_32(encoded, offset, &len) ||
          !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
        goto out;
      }
      break;
    }

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_decode_array(encoded, pool, &(entry->value.array), offset,
                              depth + 1);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      TRIVIAL_FIELD_DECODER(64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_decode_table_internal(encoded, pool, &(entry->value.table),
                                       offset, depth + 1);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}